

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void pnga_zero_patch(Integer g_a,Integer *lo,Integer *hi)

{
  int iVar1;
  double *val;
  bool bVar2;
  float fval;
  int ival;
  double dval;
  long llval;
  long lval;
  double local_88 [2];
  Integer type;
  Integer ndim;
  Integer dims [7];
  
  iVar1 = _ga_sync_end;
  val = (double *)&fval;
  ival = 0;
  lval = 0;
  llval = 0;
  dval = 0.0;
  fval = 0.0;
  bVar2 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar2) {
    pnga_sync();
  }
  pnga_inquire(g_a,&type,&ndim,dims);
  switch(type) {
  case 0x3e9:
    val = (double *)&ival;
    break;
  case 0x3ea:
    val = (double *)&lval;
    break;
  case 0x3eb:
    break;
  case 0x3ec:
    val = &dval;
    break;
  default:
    pnga_error(" wrong data type ",type);
    val = (double *)0x0;
    break;
  case 0x3ee:
    val = local_88;
    local_88[0] = 0.0;
    break;
  case 0x3ef:
    val = local_88;
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    break;
  case 0x3f8:
    val = (double *)&llval;
  }
  pnga_fill_patch(g_a,lo,hi,val);
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_zero_patch(Integer g_a, Integer *lo, Integer *hi)
{
    Integer ndim, dims[MAXDIM], type;
    int ival = 0;
    long lval = 0; 
    long llval = 0; 
    double dval = 0.0;
    DoubleComplex cval;
    SingleComplex cfval;
    float fval = 0.0;
    void *valptr = NULL;
    int local_sync_begin,local_sync_end;
    
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    
    pnga_inquire(g_a,  &type, &ndim, dims);
    
    switch (type){
        case C_INT:
            valptr = (void *)(&ival);
            break;
        case C_DBL:
            valptr = (void *)(&dval);
            break;
        case C_DCPL:
        {
            cval.real = 0.0; cval.imag = 0.0;
            valptr = (void *)(&cval);
            break;
        }
        case C_SCPL:
        {
            cfval.real = 0.0; cfval.imag = 0.0;
            valptr = (void *)(&cfval);
            break;
        }
        case C_FLOAT:
            valptr = (void *)(&fval);
            break;      
       case C_LONG:
            valptr = (void *)(&lval);
            break; 
       case C_LONGLONG:
            valptr = (void *)(&llval);
            break; 
        default: pnga_error(" wrong data type ",type);
    }
    pnga_fill_patch(g_a, lo, hi, valptr);
    
    if(local_sync_end)pnga_sync();
}